

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void SerializeMany<ParamsStream<DataStream&,TransactionSerParams>,long,CScript>
               (ParamsStream<DataStream_&,_TransactionSerParams> *s,long *args,CScript *args_1)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ser_writedata64<ParamsStream<DataStream&,TransactionSerParams>>(s,*args);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    Serialize<ParamsStream<DataStream&,TransactionSerParams>,28u,unsigned_char>
              (s,&args_1->super_CScriptBase);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}